

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_helper.h
# Opt level: O2

float Unit_Test::randomFloatValue<float>(float minimum,float maximum,float stepVal)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 in_register_00001304 [12];
  
  if ((minimum <= maximum) && (0.0 <= stepVal)) {
    iVar1 = (int)((maximum - minimum) / stepVal);
    iVar2 = 1;
    if (1 < iVar1) {
      iVar2 = iVar1;
    }
    iVar1 = rand();
    auVar3._0_4_ = (float)(iVar1 % iVar2);
    auVar3._4_12_ = in_register_00001304;
    auVar3 = vfmadd132ss_fma(auVar3,ZEXT416((uint)minimum),ZEXT416((uint)stepVal));
    minimum = auVar3._0_4_;
  }
  return minimum;
}

Assistant:

data randomFloatValue( data minimum, data maximum, data stepVal )
    {
        if (minimum > maximum || stepVal < 0)
            return minimum;

        int range = static_cast<int>( (maximum - minimum) / stepVal );
        if (range <= 0)
            range = 1;

        return static_cast<data>(rand() % range) * stepVal + minimum;
    }